

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::DoTooltip(CUI *this,void *pID,CUIRect *pRect,char *pText)

{
  bool bVar1;
  char *in_RCX;
  CUIRect *in_RDX;
  CUI *in_RSI;
  char *in_RDI;
  
  bVar1 = MouseHovered(in_RSI,in_RDX);
  if (bVar1) {
    *(CUI **)(in_RDI + 0x160) = in_RSI;
    *(undefined8 *)(in_RDI + 0x168) = *(undefined8 *)in_RDX;
    *(undefined8 *)(in_RDI + 0x170) = *(undefined8 *)&in_RDX->w;
    str_copy(in_RCX,in_RDI,0);
  }
  else if (*(CUI **)(in_RDI + 0x160) == in_RSI) {
    in_RDI[0x160] = '\0';
    in_RDI[0x161] = '\0';
    in_RDI[0x162] = '\0';
    in_RDI[0x163] = '\0';
    in_RDI[0x164] = '\0';
    in_RDI[0x165] = '\0';
    in_RDI[0x166] = '\0';
    in_RDI[0x167] = '\0';
    in_RDI[0x178] = '\0';
  }
  return;
}

Assistant:

void CUI::DoTooltip(const void *pID, const CUIRect *pRect, const char *pText)
{
	if(MouseHovered(pRect))
	{
		m_pActiveTooltip = pID;
		m_TooltipAnchor = *pRect;
		str_copy(m_aTooltipText, pText, sizeof(m_aTooltipText));
	}
	else if(m_pActiveTooltip == pID)
	{
		m_pActiveTooltip = 0;
		m_aTooltipText[0] = '\0';
	}
}